

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFontConfig *pIVar1;
  ImFont *this_00;
  void *__dest;
  long lVar2;
  ImFont *local_20;
  
  if (font_cfg->MergeMode == false) {
    this_00 = (ImFont *)ImGui::MemAlloc(0x70);
    ImFont::ImFont(this_00);
    local_20 = this_00;
    ImVector<ImFont_*>::push_back(&this->Fonts,&local_20);
  }
  ImVector<ImFontConfig>::push_back(&this->ConfigData,font_cfg);
  pIVar1 = (this->ConfigData).Data;
  lVar2 = (long)(this->ConfigData).Size;
  if (pIVar1[lVar2 + -1].DstFont == (ImFont *)0x0) {
    pIVar1[lVar2 + -1].DstFont = (this->Fonts).Data[(long)(this->Fonts).Size + -1];
  }
  if (pIVar1[lVar2 + -1].FontDataOwnedByAtlas == false) {
    __dest = ImGui::MemAlloc((long)pIVar1[lVar2 + -1].FontDataSize);
    pIVar1[lVar2 + -1].FontData = __dest;
    pIVar1[lVar2 + -1].FontDataOwnedByAtlas = true;
    memcpy(__dest,font_cfg->FontData,(long)pIVar1[lVar2 + -1].FontDataSize);
  }
  ClearTexData(this);
  return pIVar1[lVar2 + -1].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}